

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeGlobalSet(Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Name global)

{
  Name name;
  GlobalSet *pGVar1;
  bool bVar2;
  Ok local_c9;
  IRBuilder *local_c8;
  size_t local_c0;
  uint local_b4;
  Err local_b0;
  Err *local_80;
  Err *err;
  Result<wasm::Ok> _val;
  GlobalSet curr;
  IRBuilder *this_local;
  Name global_local;
  
  global_local.super_IString.str._M_len = global.super_IString.str._M_str;
  this_local = global.super_IString.str._M_len;
  pGVar1 = (GlobalSet *)
           ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
  curr.value = (Expression *)this;
  global_local.super_IString.str._M_str = (char *)__return_storage_ptr__;
  GlobalSet::GlobalSet(pGVar1);
  wasm::Name::operator=
            ((Name *)&curr.super_SpecificExpression<(wasm::Expression::Id)11>.super_Expression.type,
             (Name *)&this_local);
  UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_>::visitGlobalSet
            ((Result<wasm::Ok> *)&err,
             (UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_> *)this,pGVar1);
  local_80 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
  bVar2 = local_80 != (Err *)0x0;
  if (bVar2) {
    wasm::Err::Err(&local_b0,local_80);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_b0);
    wasm::Err::~Err(&local_b0);
  }
  local_b4 = (uint)bVar2;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
  if (local_b4 == 0) {
    local_c8 = this_local;
    local_c0 = global_local.super_IString.str._M_len;
    name.super_IString.str._M_str = (char *)global_local.super_IString.str._M_len;
    name.super_IString.str._M_len = (size_t)this_local;
    pGVar1 = Builder::makeGlobalSet
                       (&this->builder,name,(Expression *)curr.name.super_IString.str._M_str);
    push(this,(Expression *)pGVar1);
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_c9);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeGlobalSet(Name global) {
  GlobalSet curr;
  curr.name = global;
  CHECK_ERR(visitGlobalSet(&curr));
  push(builder.makeGlobalSet(global, curr.value));
  return Ok{};
}